

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * __thiscall
pbrt::
TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
::ToString_abi_cxx11_
          (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
           *this)

{
  unsigned_short *args_1;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  *in_RSI;
  string *in_RDI;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  *args;
  string *fmt;
  
  args = in_RSI;
  fmt = in_RDI;
  args_1 = (unsigned_short *)
           TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
           ::ptr(in_RSI);
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  ::Tag(in_RSI);
  StringPrintf<void_const*,unsigned_short>((char *)fmt,(void **)args,args_1);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TaggedPointer ptr: 0x%p tag: %d ]", ptr(), Tag());
    }